

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void unifyPathDelimiters(char *path,uint pathLength)

{
  char *pcVar1;
  
  if (pathLength != 0 && path != (char *)0x0) {
    pcVar1 = path + pathLength;
    for (; path < pcVar1; path = path + 1) {
      if (*path == '\\') {
        *path = '/';
      }
    }
  }
  return;
}

Assistant:

void unifyPathDelimiters(char * path, unsigned int pathLength)
{
    if (path == 0x0 || pathLength == 0)
    {
        return;
    }

    const char * end = path + pathLength;

    for (char * iter = path; iter < end; ++iter)
    {
        if (*iter == windowsPathDelim)
        {
            *iter = unixPathDelim;
        }
    }
}